

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  ParseFlags parse_flags;
  ParseStatus PVar1;
  int iVar2;
  string *utf;
  CharClassBuilder *pCVar3;
  uint8_t *puVar4;
  UGroup *g;
  Regexp *pRVar5;
  size_type sVar6;
  byte bVar7;
  uint8_t uVar8;
  Regexp *pRVar9;
  RegexpStatus *pRVar10;
  RegexpOp op;
  size_type sVar11;
  Regexp *pRVar12;
  bool bVar13;
  Rune r;
  ParseState ps;
  int hi;
  int lo;
  RegexpStatus xstatus;
  StringPiece local_c8;
  StringPiece local_b8;
  ParseState local_a8;
  int local_78;
  int local_74;
  RegexpStatus *local_70;
  StringPiece local_68;
  RegexpStatus local_50;
  
  pRVar10 = status;
  if (status == (RegexpStatus *)0x0) {
    pRVar10 = &local_50;
  }
  bVar13 = (global_flags & Latin1) == NoParseFlags;
  local_a8.rune_max_ = 0xff;
  if (bVar13) {
    local_a8.rune_max_ = 0x10ffff;
  }
  local_50.code_ = kRegexpSuccess;
  local_50.error_arg_.data_ = (const_pointer)0x0;
  local_50.error_arg_.size_ = 0;
  local_50.tmp_ = (string *)0x0;
  local_a8.whole_regexp_.data_ = s->data_;
  local_a8.whole_regexp_.size_ = s->size_;
  local_a8.stacktop_ = (Regexp *)0x0;
  local_a8.ncap_ = 0;
  local_c8.data_ = s->data_;
  local_c8.size_ = s->size_;
  local_a8.flags_ = global_flags;
  local_a8.status_ = pRVar10;
  if (!bVar13) {
    utf = (string *)operator_new(0x20);
    (utf->_M_dataplus)._M_p = (pointer)&utf->field_2;
    utf->_M_string_length = 0;
    (utf->field_2)._M_local_buf[0] = '\0';
    ConvertLatin1ToUTF8(&local_c8,utf);
    RegexpStatus::set_tmp(pRVar10,utf);
    local_c8.data_ = (utf->_M_dataplus)._M_p;
    local_c8.size_ = utf->_M_string_length;
  }
  if ((global_flags & Literal) == NoParseFlags) {
    local_70 = status;
    if (local_c8.size_ != 0) {
      sVar11 = 0;
      pRVar5 = (Regexp *)0x0;
LAB_00255097:
      parse_flags = local_a8.flags_;
      pRVar12 = (Regexp *)local_c8.data_;
      bVar7 = *(uint8_t *)local_c8.data_;
      if (0x3e < bVar7) {
        if (0x5d < bVar7) {
          if (bVar7 == 0x5e) {
            ParseState::PushSimpleOp
                      (&local_a8,((local_a8.flags_ & OneLine) >> 2) + kRegexpBeginLine);
            goto LAB_00255436;
          }
          if (bVar7 != 0x7b) {
            if (bVar7 != 0x7c) goto switchD_002550bd_caseD_25;
            ParseState::DoVerticalBar(&local_a8);
            goto LAB_00255436;
          }
          local_68.data_ = local_c8.data_;
          local_68.size_ = local_c8.size_;
          local_b8.data_ = local_c8.data_;
          local_b8.size_ = local_c8.size_;
          if ((local_c8.size_ != 0) && (*(uint8_t *)local_c8.data_ == '{')) {
            local_b8.data_ = (const_pointer)((long)local_c8.data_ + 1);
            local_b8.size_ = local_c8.size_ - 1;
            bVar13 = ParseInteger(&local_b8,&local_74);
            if ((!bVar13) || (local_b8.size_ == 0)) goto LAB_00255681;
            uVar8 = *(uint8_t *)local_b8.data_;
            iVar2 = local_74;
            if (uVar8 == ',') {
              local_b8.data_ = (const_pointer)((long)local_b8.data_ + 1);
              local_b8.size_ = local_b8.size_ - 1;
              if (local_b8.size_ == 0) goto LAB_00255681;
              if (*local_b8.data_ == '}') {
                uVar8 = '}';
                iVar2 = -1;
              }
              else {
                bVar13 = ParseInteger(&local_b8,&local_78);
                if (local_b8.size_ == 0 || !bVar13) goto LAB_00255681;
                uVar8 = *(uint8_t *)local_b8.data_;
                iVar2 = local_78;
              }
            }
            local_78 = iVar2;
            pRVar12 = (Regexp *)local_68.data_;
            if (uVar8 != '}') goto LAB_00255681;
            puVar4 = (uint8_t *)((long)local_b8.data_ + 1);
            sVar6 = local_b8.size_ - 1;
            local_c8.data_ = (const_pointer)puVar4;
            local_c8.size_ = sVar6;
            if ((local_a8.flags_ & PerlX) == NoParseFlags) {
              bVar13 = false;
            }
            else {
              if ((sVar6 == 0) || (*puVar4 != '?')) {
                bVar13 = false;
              }
              else {
                bVar13 = true;
                local_c8.data_ = (const_pointer)((long)local_b8.data_ + 2);
                local_c8.size_ = local_b8.size_ - 2;
              }
              if (sVar11 != 0) {
                pRVar10->code_ = kRegexpRepeatOp;
                pRVar10 = &local_50;
                if (local_70 != (RegexpStatus *)0x0) {
                  pRVar10 = local_70;
                }
                (pRVar10->error_arg_).data_ = (const_pointer)pRVar5;
                (pRVar10->error_arg_).size_ = (long)local_c8.data_ - (long)pRVar5;
                local_b8.data_ = (const_pointer)puVar4;
                local_b8.size_ = sVar6;
                goto LAB_0025577c;
              }
            }
            sVar11 = (long)local_c8.data_ - (long)local_68.data_;
            local_b8.data_ = (const_pointer)puVar4;
            local_b8.size_ = sVar6;
            local_68.size_ = sVar11;
            bVar13 = ParseState::PushRepetition(&local_a8,local_74,local_78,&local_68,bVar13);
            if (bVar13) goto LAB_002556a7;
            goto LAB_0025577c;
          }
LAB_00255681:
          ParseState::PushLiteral(&local_a8,0x7b);
          local_c8.data_ = (const_pointer)((long)local_c8.data_ + 1);
          local_c8.size_ = local_c8.size_ - 1;
          sVar11 = 0;
          pRVar12 = (Regexp *)0x0;
          goto LAB_002556a7;
        }
        if (bVar7 == 0x3f) {
          op = kRegexpQuest;
          goto LAB_00255238;
        }
        if (bVar7 == 0x5b) {
          bVar13 = ParseState::ParseCharClass(&local_a8,&local_c8,(Regexp **)&local_b8,pRVar10);
          if (bVar13) {
            ParseState::PushRegexp(&local_a8,(Regexp *)local_b8.data_);
            goto LAB_0025559f;
          }
          goto LAB_0025577c;
        }
        if (bVar7 != 0x5c) goto switchD_002550bd_caseD_25;
        if ((local_a8.flags_ >> 8 & 1) == 0) {
LAB_00255102:
          if ((local_a8.flags_ >> 9 & 1) == 0) {
            if (local_c8.size_ != 1) {
              bVar7 = *(uint8_t *)((long)local_c8.data_ + 1);
              goto LAB_0025511a;
            }
            goto LAB_00255502;
          }
          if (local_c8.size_ == 1) goto LAB_00255502;
          bVar7 = *(uint8_t *)((long)local_c8.data_ + 1);
          if (bVar7 < 0x51) {
            if (bVar7 == 0x41) {
              ParseState::PushSimpleOp(&local_a8,kRegexpBeginText);
            }
            else {
              if (bVar7 != 0x43) goto LAB_0025511a;
              ParseState::PushSimpleOp(&local_a8,kRegexpAnyByte);
            }
LAB_0025541c:
            local_c8.data_ = (const_pointer)((long)local_c8.data_ + 2);
            local_c8.size_ = local_c8.size_ - 2;
            goto LAB_00255447;
          }
          if (bVar7 == 0x51) {
            local_c8.data_ = (const_pointer)((long)local_c8.data_ + 2);
            local_c8.size_ = local_c8.size_ - 2;
            do {
              if (local_c8.size_ != 1) {
                sVar11 = local_c8.size_;
                if (local_c8.size_ == 0) goto LAB_002555a2;
                if ((*(uint8_t *)local_c8.data_ == '\\') &&
                   ((char)*(uint16_t *)((long)local_c8.data_ + 1) == 'E')) goto LAB_002556f1;
              }
              iVar2 = StringPieceToRune((Rune *)&local_b8,&local_c8,pRVar10);
              if (iVar2 < 0) goto LAB_0025577c;
              ParseState::PushLiteral(&local_a8,(Rune)local_b8.data_);
            } while( true );
          }
          if (bVar7 == 0x7a) {
            ParseState::PushSimpleOp(&local_a8,kRegexpEndText);
            goto LAB_0025541c;
          }
LAB_0025511a:
          if ((bVar7 | 0x20) == 0x70) {
            pRVar5 = (Regexp *)operator_new(0x28);
            Regexp(pRVar5,kRegexpCharClass,
                   parse_flags &
                   (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|
                    Latin1|OneLine|MatchNL|Literal));
            pCVar3 = (CharClassBuilder *)operator_new(0x40);
            CharClassBuilder::CharClassBuilder(pCVar3);
            (pRVar5->field_7).field_3.ccb_ = pCVar3;
            PVar1 = ParseUnicodeGroup(&local_c8,parse_flags,pCVar3,pRVar10);
            if (PVar1 == kParseOk) {
              ParseState::PushRegexp(&local_a8,pRVar5);
              goto LAB_0025559f;
            }
            if (PVar1 == kParseNothing) {
              Decref(pRVar5);
              goto LAB_00255502;
            }
            if (PVar1 == kParseError) {
              Decref(pRVar5);
              goto LAB_0025577c;
            }
          }
        }
        else if (local_c8.size_ != 1) {
          if ((*(uint8_t *)((long)local_c8.data_ + 1) | 0x20) != 0x62) goto LAB_00255102;
          ParseState::PushSimpleOp
                    (&local_a8,
                     *(uint8_t *)((long)local_c8.data_ + 1) == 0x62 ^ kRegexpNoWordBoundary);
          goto LAB_0025541c;
        }
LAB_00255502:
        g = MaybeParsePerlCCEscape(&local_c8,parse_flags);
        if (g != (UGroup *)0x0) {
          pRVar5 = (Regexp *)operator_new(0x28);
          Regexp(pRVar5,kRegexpCharClass,
                 parse_flags &
                 (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|
                  Latin1|OneLine|MatchNL|Literal));
          pCVar3 = (CharClassBuilder *)operator_new(0x40);
          CharClassBuilder::CharClassBuilder(pCVar3);
          (pRVar5->field_7).field_3.ccb_ = pCVar3;
          AddUGroup(pCVar3,g,g->sign,parse_flags);
          ParseState::PushRegexp(&local_a8,pRVar5);
          goto LAB_0025559f;
        }
        bVar13 = ParseEscape(&local_c8,(Rune *)&local_b8,pRVar10,local_a8.rune_max_);
        if (!bVar13) goto LAB_0025577c;
        ParseState::PushLiteral(&local_a8,(Rune)local_b8.data_);
LAB_0025559f:
        sVar11 = 0;
LAB_002555a2:
        pRVar12 = (Regexp *)0x0;
        goto LAB_002556a7;
      }
      switch(bVar7) {
      case 0x24:
        ParseState::PushDollar(&local_a8);
        break;
      default:
switchD_002550bd_caseD_25:
        iVar2 = StringPieceToRune((Rune *)&local_b8,&local_c8,pRVar10);
        if (-1 < iVar2) {
          ParseState::PushLiteral(&local_a8,(Rune)local_b8.data_);
          goto LAB_0025559f;
        }
        goto LAB_0025577c;
      case 0x28:
        if ((local_c8.size_ == 1 || (local_a8.flags_ >> 9 & 1) == 0) ||
           (*(uint8_t *)((long)local_c8.data_ + 1) != '?')) {
          if ((local_a8.flags_ >> 0xc & 1) == 0) {
            local_b8.data_ = (const_pointer)0x0;
            local_b8.size_ = 0;
            ParseState::DoLeftParen(&local_a8,&local_b8);
          }
          else {
            ParseState::DoLeftParenNoCapture(&local_a8);
          }
          break;
        }
        bVar13 = ParseState::ParsePerlFlags(&local_a8,&local_c8);
        if (!bVar13) goto LAB_0025577c;
        goto LAB_0025559f;
      case 0x29:
        bVar13 = ParseState::DoRightParen(&local_a8);
        if (!bVar13) goto LAB_0025577c;
        break;
      case 0x2a:
        op = kRegexpStar;
        goto LAB_00255238;
      case 0x2b:
        op = kRegexpPlus;
LAB_00255238:
        local_b8.data_ = local_c8.data_;
        local_b8.size_ = local_c8.size_;
        pRVar9 = (Regexp *)((long)local_c8.data_ + 1);
        sVar6 = local_c8.size_ - 1;
        if ((local_a8.flags_ & PerlX) == NoParseFlags) {
          bVar13 = false;
          local_c8.data_ = (const_pointer)pRVar9;
          local_c8.size_ = sVar6;
        }
        else {
          if ((sVar6 == 0) || (*(uint8_t *)pRVar9 != '?')) {
            bVar13 = false;
            local_c8.size_ = sVar6;
          }
          else {
            pRVar9 = (Regexp *)((long)local_c8.data_ + 2);
            bVar13 = true;
            local_c8.size_ = local_c8.size_ - 2;
          }
          local_c8.data_ = (const_pointer)pRVar9;
          if (sVar11 != 0) {
            pRVar10->code_ = kRegexpRepeatOp;
            pRVar10 = &local_50;
            if (local_70 != (RegexpStatus *)0x0) {
              pRVar10 = local_70;
            }
            (pRVar10->error_arg_).data_ = (const_pointer)pRVar5;
            (pRVar10->error_arg_).size_ = (long)pRVar9 - (long)pRVar5;
            goto LAB_0025577c;
          }
        }
        sVar11 = (long)local_c8.data_ - (long)pRVar12;
        local_b8.size_ = sVar11;
        bVar13 = ParseState::PushRepeatOp(&local_a8,op,&local_b8,bVar13);
        if (bVar13) goto LAB_002556a7;
        goto LAB_0025577c;
      case 0x2e:
        ParseState::PushDot(&local_a8);
      }
LAB_00255436:
      local_c8.data_ = (const_pointer)((long)local_c8.data_ + 1);
      local_c8.size_ = local_c8.size_ - 1;
      goto LAB_00255447;
    }
LAB_0025574e:
    pRVar5 = ParseState::DoFinish(&local_a8);
  }
  else {
    if (local_c8.size_ != 0) {
      do {
        iVar2 = StringPieceToRune((Rune *)&local_b8,&local_c8,pRVar10);
        if (iVar2 < 0) goto LAB_0025577c;
        ParseState::PushLiteral(&local_a8,(Rune)local_b8.data_);
      } while (local_c8.size_ != 0);
    }
    pRVar5 = ParseState::DoFinish(&local_a8);
  }
LAB_0025577e:
  ParseState::~ParseState(&local_a8);
  RegexpStatus::~RegexpStatus(&local_50);
  return pRVar5;
LAB_002556f1:
  local_c8.data_ = (const_pointer)((long)local_c8.data_ + 2);
  local_c8.size_ = local_c8.size_ - 2;
LAB_00255447:
  sVar11 = 0;
  pRVar12 = (Regexp *)0x0;
LAB_002556a7:
  pRVar5 = pRVar12;
  if (local_c8.size_ == 0) goto LAB_0025574e;
  goto LAB_00255097;
LAB_0025577c:
  pRVar5 = (Regexp *)0x0;
  goto LAB_0025577e;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    std::string* tmp = new std::string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (!t.empty()) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = StringPiece();
  while (!t.empty()) {
    StringPiece isunary = StringPiece();
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(StringPiece()))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCaret())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (!t.empty() && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (!lastunary.empty()) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (!t.empty() && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (!lastunary.empty()) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (!t.empty()) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}